

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

bitarr_address_t longest_insert(longest_t *longest,uint32 index)

{
  uint8 *puVar1;
  int iVar2;
  bitarr_address_t bVar3;
  bitarr_address_t address_00;
  uint32 index_local;
  longest_t *longest_local;
  bitarr_address_t address;
  
  if (index <= (longest->base).word_mask) {
    puVar1 = (longest->base).base;
    iVar2 = (longest->base).insert_index * (uint)(longest->base).total_bits;
    address_00.offset = iVar2;
    address_00.base = puVar1;
    address_00._12_4_ = 0;
    bitarr_write_int25(address_00,(longest->base).word_bits,index);
    (longest->base).insert_index = (longest->base).insert_index + 1;
    bVar3.offset = iVar2 + (uint)(longest->base).word_bits;
    bVar3.base = puVar1;
    bVar3._12_4_ = 0;
    return bVar3;
  }
  __assert_fail("index <= longest->base.word_mask",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                ,0x99,"bitarr_address_t longest_insert(longest_t *, uint32)");
}

Assistant:

static bitarr_address_t
longest_insert(longest_t * longest, uint32 index)
{
    bitarr_address_t address;
    assert(index <= longest->base.word_mask);
    address.base = longest->base.base;
    address.offset = longest->base.insert_index * longest->base.total_bits;
    bitarr_write_int25(address, longest->base.word_bits, index);
    address.offset += longest->base.word_bits;
    longest->base.insert_index++;
    return address;
}